

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O0

meta_redirect_type_enum ctemplate_htmlparser::meta_redirect_type(char *value)

{
  int iVar1;
  char *pcVar2;
  char *local_18;
  char *value_local;
  
  if (value == (char *)0x0) {
    value_local._4_4_ = META_REDIRECT_TYPE_NONE;
  }
  else {
    pcVar2 = ignore_spaces_or_digits(value);
    if (*pcVar2 == ';') {
      pcVar2 = ignore_spaces(pcVar2 + 1);
      iVar1 = strncasecmp(pcVar2,"url",3);
      if (iVar1 == 0) {
        pcVar2 = ignore_spaces(pcVar2 + 3);
        if (*pcVar2 == '=') {
          local_18 = ignore_spaces(pcVar2 + 1);
          if ((*local_18 == '\"') || (*local_18 == '\'')) {
            local_18 = local_18 + 1;
          }
          if (*local_18 == '\0') {
            value_local._4_4_ = META_REDIRECT_TYPE_URL_START;
          }
          else {
            value_local._4_4_ = META_REDIRECT_TYPE_URL;
          }
        }
        else {
          value_local._4_4_ = META_REDIRECT_TYPE_NONE;
        }
      }
      else {
        value_local._4_4_ = META_REDIRECT_TYPE_NONE;
      }
    }
    else {
      value_local._4_4_ = META_REDIRECT_TYPE_NONE;
    }
  }
  return value_local._4_4_;
}

Assistant:

enum meta_redirect_type_enum meta_redirect_type(const char *value) {

  if (value == NULL)
    return META_REDIRECT_TYPE_NONE;

  /* Match while [ \t\r\n0-9]* */
  value = ignore_spaces_or_digits(value);

  /* Verify that we got a semi-colon character */
  if (*value != ';')
    return META_REDIRECT_TYPE_NONE;
  value++;

  /* Match while [ \t\r\n]* */
  value = ignore_spaces(value);

  /* Validate that we have 'URL' */
  if (strncasecmp(value, "url", strlen("url")) != 0)
    return META_REDIRECT_TYPE_NONE;

  value += strlen("url");

  /* Match while [ \t\r\n]* */
  value = ignore_spaces(value);

  if (*value != '=')
    return META_REDIRECT_TYPE_NONE;
  value++;

  /* Match while [ \t\r\n]* */
  value = ignore_spaces(value);

  /* The HTML5 spec allows for the url to be quoted, so we skip a single or
   * double quote if we find one.
   */
  if (*value == '"' || *value == '\'')
    value++;

  if (*value == '\0')
    return META_REDIRECT_TYPE_URL_START;
  else
    return META_REDIRECT_TYPE_URL;
}